

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O0

pcp_errno pcp_delete_flow_intern(pcp_flow_t *f)

{
  pcp_server_t *ppVar1;
  pcp_server_t *s;
  pcp_flow_t *f_local;
  
  if (f != (pcp_flow_t *)0x0) {
    pcp_db_rem_flow(f);
    if (f->pcp_msg_buffer != (char *)0x0) {
      free(f->pcp_msg_buffer);
    }
    if (f->md_vals != (md_val_t *)0x0) {
      free(f->md_vals);
    }
    if (f->sadscp_app_name != (char *)0x0) {
      free(f->sadscp_app_name);
    }
    if (f->pcp_server_indx != 0xffffffff) {
      ppVar1 = get_pcp_server(f->ctx,f->pcp_server_indx);
      if ((ppVar1 != (pcp_server_t *)0x0) && (ppVar1->ping_flow_msg == f)) {
        ppVar1->ping_flow_msg = (pcp_flow_t *)0x0;
      }
    }
    free(f);
    return PCP_ERR_SUCCESS;
  }
  __assert_fail("f",
                "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_client_db.c"
                ,0x67,"pcp_errno pcp_delete_flow_intern(pcp_flow_t *)");
}

Assistant:

pcp_errno pcp_delete_flow_intern(pcp_flow_t *f) {
    pcp_server_t *s;

    assert(f);

    pcp_db_rem_flow(f);

    if (f->pcp_msg_buffer) {
        free(f->pcp_msg_buffer);
    }

#ifdef PCP_EXPERIMENTAL
    if (f->md_vals) {
        free(f->md_vals);
    }
#endif

#ifdef PCP_SADSCP
    if (f->sadscp_app_name) {
        free(f->sadscp_app_name);
    }
#endif

    if ((f->pcp_server_indx != PCP_INV_SERVER) &&
        ((s = get_pcp_server(f->ctx, f->pcp_server_indx)) != NULL) &&
        (s->ping_flow_msg == f)) {
        s->ping_flow_msg = NULL;
    }

    free(f);
    return PCP_ERR_SUCCESS;
}